

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_SetIssuance_Test::TestBody(ConfidentialTransaction_SetIssuance_Test *this)

{
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  AssertHelperData *pAVar4;
  AssertHelperData *pAVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  uint in_stack_fffffffffffffbc8;
  uint uVar9;
  undefined4 in_stack_fffffffffffffbcc;
  undefined4 uVar10;
  pointer in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  AssertionResult gtest_ar_2;
  undefined1 local_408 [40];
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  uint32_t local_3b8;
  Script local_3b0;
  uint32_t local_378;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_368;
  ByteData256 BStack_350;
  ByteData256 BStack_338;
  ConfidentialValue CStack_320;
  ConfidentialValue CStack_2f8;
  ByteData BStack_2d0;
  ByteData BStack_2b8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> vStack_298;
  ByteData256 local_280;
  ByteData256 local_268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  ConfidentialValue local_220;
  ConfidentialValue local_1f8;
  ConfidentialTxInReference txin;
  ConfidentialTransaction tx;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,&exp_tx_hex_abi_cxx11_);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    uVar3 = 0;
    if (bVar2) {
      uVar3 = cfd::core::ConfidentialTransaction::AddTxIn(&tx,&exp_txid,2,0xfffffffe,&exp_script);
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10b,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*txin.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
      }
    }
    uVar3 = 0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_268.data_,&exp_blinding_nonce.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_280.data_,&exp_asset_entropy.data_);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_1f8,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_220,&exp_inflation_keys);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_238,&exp_issuance_amount_rangeproof.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_250,&exp_inflation_keys_rangeproof.data_);
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_250;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_238;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffbc8;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffbcc;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbd8;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffffbd0;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffbe0;
      cfd::core::ConfidentialTransaction::SetIssuance
                (&tx,uVar3,&local_268,&local_280,&local_1f8,&local_220,issuance_amount_rangeproof,
                 inflation_keys_rangeproof);
      if (local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_250.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_220._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007e7aa0;
      if (local_220.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_220.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_220.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_1f8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007e7aa0;
      if (local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_280.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_280.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_280.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&txin);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x111,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&txin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (txin.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*txin.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
      }
    }
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txin);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetTxIn((ConfidentialTxInReference *)&gtest_ar,&tx,1);
      cfd::core::Txid::operator=(&txin.super_AbstractTxInReference.txid_,(Txid *)&gtest_ar.message_)
      ;
      txin.super_AbstractTxInReference.vout_ = local_3b8;
      cfd::core::Script::operator=(&txin.super_AbstractTxInReference.unlocking_script_,&local_3b0);
      txin.super_AbstractTxInReference.sequence_ = local_378;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&txin.super_AbstractTxInReference.script_witness_.witness_stack_,&local_368);
      cfd::core::ByteData256::operator=(&txin.blinding_nonce_,&BStack_350);
      cfd::core::ByteData256::operator=(&txin.asset_entropy_,&BStack_338);
      cfd::core::ConfidentialValue::operator=(&txin.issuance_amount_,&CStack_320);
      cfd::core::ConfidentialValue::operator=(&txin.inflation_keys_,&CStack_2f8);
      cfd::core::ByteData::operator=(&txin.issuance_amount_rangeproof_,&BStack_2d0);
      cfd::core::ByteData::operator=(&txin.inflation_keys_rangeproof_,&BStack_2b8);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&txin.pegin_witness_.witness_stack_,&vStack_298);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x114,
               "Expected: (txin = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  uVar3 = txin.super_AbstractTxInReference.vout_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetVout()","exp_index",(uint *)&stack0xfffffffffffffbc8,
             &exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffbc8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x116,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_408,(Message *)&stack0xfffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_408);
    if (CONCAT44(in_stack_fffffffffffffbcc,uVar3) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(in_stack_fffffffffffffbcc,uVar3) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffbcc,uVar3) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar3 = txin.super_AbstractTxInReference.sequence_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetSequence()","exp_sequence",
             (uint *)&stack0xfffffffffffffbc8,&exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffbc8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x117,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_408,(Message *)&stack0xfffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_408);
    if (CONCAT44(in_stack_fffffffffffffbcc,uVar3) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(in_stack_fffffffffffffbcc,uVar3) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffbcc,uVar3) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffbc8,&txin.super_AbstractTxInReference.txid_);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,(Txid *)&stack0xfffffffffffffbc8);
  uVar1 = gtest_ar._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_408,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             (char *)uVar1,(char *)local_408._0_8_);
  pAVar5 = (AssertHelperData *)(local_408 + 0x10);
  if ((AssertHelperData *)local_408._0_8_ != pAVar5) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3d0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3d0._M_allocated_capacity + 1));
  }
  uVar9 = 0x7d4398;
  uVar10 = 0;
  if (in_stack_fffffffffffffbd0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffbd0,
                    in_stack_fffffffffffffbe0 - (long)in_stack_fffffffffffffbd0);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x118,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)&gtest_ar,&txin.super_AbstractTxInReference.unlocking_script_)
  ;
  cfd::core::Script::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffbc8,(Script *)&gtest_ar);
  pcVar7 = (char *)CONCAT44(uVar10,uVar9);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_408,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar7,(char *)local_408._0_8_);
  if ((AssertHelperData *)local_408._0_8_ != pAVar5) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
  }
  if ((undefined1 *)CONCAT44(uVar10,uVar9) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar10,uVar9),(ulong)(in_stack_fffffffffffffbd8 + 1));
  }
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11a,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408._0_8_ = (AssertHelperData *)0x0;
  local_408._8_8_ = (pointer)0x0;
  local_408._16_8_ = 0;
  uVar6 = (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
    sVar8 = (long)txin.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_408._16_8_ = uVar6 + (long)pAVar4;
  local_408._0_8_ = pAVar4;
  if (txin.blinding_nonce_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      txin.blinding_nonce_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_408._8_8_ = pAVar4;
    memmove(pAVar4,txin.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_408._8_8_ = (long)&pAVar4->type + sVar8;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)local_408);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffbc8,&exp_blinding_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",(char *)uVar1,(char *)CONCAT44(uVar10,uVar9));
  if ((undefined1 *)CONCAT44(uVar10,uVar9) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar10,uVar9),(ulong)(in_stack_fffffffffffffbd8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3d0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3d0._M_allocated_capacity + 1));
  }
  if ((AssertHelperData *)local_408._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ - local_408._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11c,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408._0_8_ = (AssertHelperData *)0x0;
  local_408._8_8_ = (pointer)0x0;
  local_408._16_8_ = 0;
  uVar6 = (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
    sVar8 = (long)txin.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_408._16_8_ = uVar6 + (long)pAVar4;
  local_408._0_8_ = pAVar4;
  if (txin.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      txin.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_408._8_8_ = pAVar4;
    memmove(pAVar4,txin.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_408._8_8_ = (long)&pAVar4->type + sVar8;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)local_408);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffbc8,&exp_asset_entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",(char *)uVar1,(char *)CONCAT44(uVar10,uVar9));
  if ((undefined1 *)CONCAT44(uVar10,uVar9) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar10,uVar9),(ulong)(in_stack_fffffffffffffbd8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3d0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3d0._M_allocated_capacity + 1));
  }
  if ((AssertHelperData *)local_408._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ - local_408._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11e,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&stack0xfffffffffffffbc8,(ConfidentialValue *)&gtest_ar);
  pcVar7 = (char *)CONCAT44(uVar10,uVar9);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_408,&exp_issuance_amount);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar7,(char *)local_408._0_8_);
  if ((AssertHelperData *)local_408._0_8_ != pAVar5) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
  }
  if ((undefined1 *)CONCAT44(uVar10,uVar9) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar10,uVar9),(ulong)(in_stack_fffffffffffffbd8 + 1));
  }
  gtest_ar._0_8_ = &PTR__ConfidentialValue_007e7aa0;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_,local_3d0._8_8_ - (long)gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x120,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&stack0xfffffffffffffbc8,(ConfidentialValue *)&gtest_ar);
  pcVar7 = (char *)CONCAT44(uVar10,uVar9);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_408,&exp_inflation_keys);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar7,(char *)local_408._0_8_);
  if ((AssertHelperData *)local_408._0_8_ != pAVar5) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
  }
  if ((undefined1 *)CONCAT44(uVar10,uVar9) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar10,uVar9),(ulong)(in_stack_fffffffffffffbd8 + 1));
  }
  gtest_ar._0_8_ = &PTR__ConfidentialValue_007e7aa0;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_,local_3d0._8_8_ - (long)gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x122,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408._0_8_ = (AssertHelperData *)0x0;
  local_408._8_8_ = (pointer)0x0;
  local_408._16_8_ = 0;
  uVar6 = (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar5 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar5 = (AssertHelperData *)operator_new(uVar6);
    sVar8 = (long)txin.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_408._16_8_ = uVar6 + (long)pAVar5;
  local_408._0_8_ = pAVar5;
  if (txin.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      txin.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_408._8_8_ = pAVar5;
    memmove(pAVar5,txin.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_408._8_8_ = (long)&pAVar5->type + sVar8;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)local_408);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)&stack0xfffffffffffffbc8,&exp_issuance_amount_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",(char *)uVar1,
             (char *)CONCAT44(uVar10,uVar9));
  if ((undefined1 *)CONCAT44(uVar10,uVar9) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar10,uVar9),(ulong)(in_stack_fffffffffffffbd8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3d0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3d0._M_allocated_capacity + 1));
  }
  if ((AssertHelperData *)local_408._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ - local_408._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x124,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_408._0_8_ = (AssertHelperData *)0x0;
  local_408._8_8_ = (pointer)0x0;
  local_408._16_8_ = 0;
  uVar6 = (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar5 = (AssertHelperData *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar5 = (AssertHelperData *)operator_new(uVar6);
    sVar8 = (long)txin.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_408._16_8_ = uVar6 + (long)pAVar5;
  local_408._0_8_ = pAVar5;
  if (txin.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      txin.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_408._8_8_ = pAVar5;
    memmove(pAVar5,txin.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  local_408._8_8_ = (long)&pAVar5->type + sVar8;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)local_408);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)&stack0xfffffffffffffbc8,&exp_inflation_keys_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",(char *)uVar1,
             (char *)CONCAT44(uVar10,uVar9));
  if ((undefined1 *)CONCAT44(uVar10,uVar9) != &stack0xfffffffffffffbd8) {
    operator_delete((undefined1 *)CONCAT44(uVar10,uVar9),(ulong)(in_stack_fffffffffffffbd8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3d0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3d0._M_allocated_capacity + 1));
  }
  if ((AssertHelperData *)local_408._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ - local_408._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x126,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffbc8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txin);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetIssuance) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));

  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));

  ConfidentialTxInReference txin;
  EXPECT_NO_THROW((txin = tx.GetTxIn(1)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
               exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
               exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
               exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
               exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
               exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
               exp_inflation_keys_rangeproof.GetHex().c_str());
}